

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O0

bool ValidMonthDayCombo(int month,int day)

{
  int day_local;
  int month_local;
  
  if ((day < 1) || (0x1c < day)) {
    if (((day == 0x1d) || (day == 0x1e)) && (month != 2)) {
      day_local._3_1_ = true;
    }
    else if ((day == 0x1f) &&
            ((((month == 1 || (month == 3)) || (month == 5)) ||
             (((month == 7 || (month == 8)) || ((month == 10 || (month == 0xc)))))))) {
      day_local._3_1_ = true;
    }
    else {
      day_local._3_1_ = false;
    }
  }
  else {
    day_local._3_1_ = true;
  }
  return day_local._3_1_;
}

Assistant:

bool ValidMonthDayCombo(int month, int day)
{
    if(day >= 1 && day <= 28)
    {
        return true;
    }
    else if((day == 29 || day == 30) && month != 2)
    {
        return true;
    }
    else if(day == 31 && (month == 1 || month == 3 || month == 5 || month == 7 || month == 8 || month == 10 || month == 12))
    {
        return true;
    }
    else
    {
        return false;
    }
}